

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *__stream;
  char *__s1;
  int iVar1;
  size_t sVar2;
  TD_run *t;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int long_index;
  timeval tv_1;
  Task local_88;
  timeval local_40;
  
  local_88.f = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
               ((ulong)local_88.f & 0xffffffff00000000);
  do {
    while (iVar1 = getopt_long(argc,argv,"w:s:h",parse_args_longopts,&local_88), __s1 = _optarg,
          0x67 < iVar1) {
      if (iVar1 == 0x73) {
        iVar1 = strcmp(_optarg,"bfs");
        if (iVar1 == 0) {
          strategy = 0;
        }
        else {
          iVar1 = strcmp(__s1,"par");
          if (iVar1 == 0) {
            strategy = 1;
          }
          else {
            iVar1 = strcmp(__s1,"sat");
            if (iVar1 == 0) {
              strategy = 2;
            }
            else {
              iVar1 = strcmp(__s1,"chaining");
              if (iVar1 != 0) goto LAB_001059d1;
              strategy = 3;
            }
          }
        }
      }
      else if (iVar1 == 0x77) {
        workers = atoi(_optarg);
      }
      else if (iVar1 == 0x68) {
        print_help();
        goto LAB_001059d6;
      }
    }
    switch(iVar1) {
    case 0:
      break;
    case 1:
      report_levels = 1;
      break;
    case 2:
      report_table = 1;
      break;
    case 3:
      check_deadlocks = 1;
      break;
    case 4:
      print_transition_matrix = 1;
      break;
    case 5:
      report_nodes = 1;
      break;
    case -1:
      if (_optind < argc) {
        model_filename = argv[_optind];
        if (_optind + 1 < argc) {
          out_filename = argv[_optind + 1];
        }
        setlocale(1,"en_US.utf-8");
        gettimeofday((timeval *)&local_88,(__timezone_ptr_t)0x0);
        t_start = (double)(long)local_88.thief * 1e-06 + (double)(long)local_88.f;
        lace_start(workers,1000000);
        sVar2 = getMaxMemory();
        if (sVar2 >> 0x22 == 0) {
          sVar2 = getMaxMemory();
          sVar2 = (sVar2 / 10) * 9;
        }
        else {
          sVar2 = 0x400000000;
        }
        printf("Setting Sylvan main tables memory to ");
        auVar3._8_4_ = (int)(sVar2 >> 0x20);
        auVar3._0_8_ = sVar2;
        auVar3._12_4_ = 0x45300000;
        print_h((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
        puts(" max.");
        sylvan_set_limits(sVar2,1,0x10);
        sylvan_init_package();
        sylvan_init_ldd();
        sylvan_gc_hook_pregc(gc_start_CALL);
        sylvan_gc_hook_postgc(gc_end_CALL);
        local_88.f = run_WRAP;
        local_88.thief = (_Worker *)0x1;
        lace_run_task(&local_88);
        sVar2 = getCurrentRSS();
        auVar4._8_4_ = (int)(sVar2 >> 0x20);
        auVar4._0_8_ = sVar2;
        auVar4._12_4_ = 0x45300000;
        to_h((auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0),(char *)&local_88);
        __stream = _stdout;
        gettimeofday(&local_40,(__timezone_ptr_t)0x0);
        fprintf(__stream,"[% 8.2f] Memory usage: %s\n",
                ((double)local_40.tv_usec * 1e-06 + (double)local_40.tv_sec) - t_start,&local_88);
        sylvan_stats_report((FILE *)_stdout);
        lace_stop();
        return 0;
      }
LAB_001059d1:
      print_usage();
LAB_001059d6:
      exit(0);
    default:
      if (iVar1 == 99) goto LAB_001059d1;
    }
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
    /**
     * Parse command line, set locale, set startup time for INFO messages.
     */
    parse_args(argc, argv);
    setlocale(LC_NUMERIC, "en_US.utf-8");
    t_start = wctime();

    /**
     * Initialize Lace.
     *
     * First: setup with given number of workers (0 for autodetect) and some large size task queue.
     * Second: start all worker threads with default settings.
     * Third: setup local variables using the LACE_ME macro.
     */
    lace_start(workers, 1000000);

    /**
     * Initialize Sylvan.
     *
     * First: set memory limits
     * - 2 GB memory, nodes table twice as big as cache, initial size halved 6x
     *   (that means it takes 6 garbage collections to get to the maximum nodes&cache size)
     * Second: initialize package and subpackages
     * Third: add hooks to report garbage collection
     */

    size_t max = 16LL<<30;
    if (max > getMaxMemory()) max = getMaxMemory()/10*9;
    printf("Setting Sylvan main tables memory to ");
    print_h(max);
    printf(" max.\n");

    sylvan_set_limits(max, 1, 16);
    sylvan_init_package();
    sylvan_init_ldd();
    sylvan_gc_hook_pregc(TASK(gc_start));
    sylvan_gc_hook_postgc(TASK(gc_end));

    RUN(run);

    print_memory_usage();
    sylvan_stats_report(stdout);

    lace_stop();
}